

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_op(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  long in_RSI;
  jit_State *in_RDI;
  TRef tr;
  TRef hdr;
  TRef str;
  TRef in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  TVar1 = lj_ir_tostr((jit_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  TVar2 = recff_bufhdr((jit_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  TVar3 = lj_ir_call(in_RDI,(IRCallID)(ulong)*(uint *)(in_RSI + 0x10),(ulong)TVar2,(ulong)TVar1);
  (in_RDI->fold).ins.field_0.ot = 0x5504;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold((jit_State *)CONCAT44(TVar1,TVar2));
  *in_RDI->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_op(jit_State *J, RecordFFData *rd)
{
  TRef str = lj_ir_tostr(J, J->base[0]);
  TRef hdr = recff_bufhdr(J);
  TRef tr = lj_ir_call(J, rd->data, hdr, str);
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
}